

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWriter.cpp
# Opt level: O3

void __thiscall
internalJSONNode::WriteChildren(internalJSONNode *this,uint indent,json_string *output)

{
  json_string *pjVar1;
  uint amount;
  JSONNode **ppJVar2;
  ulong uVar3;
  uint uVar4;
  json_string indent_plus_one;
  JSONNode **local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  json_string local_50;
  
  uVar4 = this->Children->mysize;
  if ((ulong)uVar4 == 0) {
    return;
  }
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = 0;
  if (indent == 0xffffffff) {
    ppJVar2 = this->Children->array;
    local_98 = ppJVar2 + uVar4;
    amount = 0xffffffff;
  }
  else {
    pjVar1 = jsonSingletonNEW_LINE::getValue_abi_cxx11_();
    amount = indent + 1;
    makeIndent_abi_cxx11_(&local_50,amount);
    std::operator+(&local_70,pjVar1,&local_50);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    uVar4 = this->Children->mysize;
    if ((ulong)uVar4 == 0) goto LAB_0016d7d7;
    ppJVar2 = this->Children->array;
    local_98 = ppJVar2 + uVar4;
  }
  uVar3 = 0;
  do {
    std::__cxx11::string::_M_append((char *)output,(ulong)local_90);
    Write((*ppJVar2)->internal,amount,this->_type == '\x04',output);
    if (uVar3 < uVar4 - 1) {
      std::__cxx11::string::push_back((char)output);
    }
    ppJVar2 = ppJVar2 + 1;
    uVar3 = uVar3 + 1;
  } while (ppJVar2 != local_98);
LAB_0016d7d7:
  if (amount != 0xffffffff) {
    pjVar1 = jsonSingletonNEW_LINE::getValue_abi_cxx11_();
    std::__cxx11::string::_M_append((char *)output,(ulong)(pjVar1->_M_dataplus)._M_p);
    makeIndent_abi_cxx11_(&local_70,amount - 1);
    std::__cxx11::string::_M_append((char *)output,(ulong)local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  return;
}

Assistant:

void internalJSONNode::WriteChildren(unsigned int indent, json_string & output) const json_nothrow {
    //Iterate through the children and write them
    if (json_likely(CHILDREN -> empty())) return;

    json_string indent_plus_one;
    //handle whether or not it's formatted JSON
    if (indent != 0xFFFFFFFF){  //it's formatted, make the indentation strings
	   indent_plus_one = json_global(NEW_LINE) + makeIndent(++indent);
    }

    //else it's not formatted, leave the indentation strings empty
    const size_t size_minus_one = CHILDREN -> size() - 1;
    size_t i = 0;
    JSONNode ** it = CHILDREN -> begin();
    for(JSONNode ** it_end = CHILDREN -> end(); it != it_end; ++it, ++i){

		output += indent_plus_one;
		(*it) -> internal -> Write(indent, type() == JSON_ARRAY, output);
	    if (json_likely(i < size_minus_one)) output += JSON_TEXT(',');  //the last one does not get a comma, but all of the others do
    }
    if (indent != 0xFFFFFFFF){
		output += json_global(NEW_LINE);
		output += makeIndent(indent - 1);
    }
}